

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

BoxCoordinatesMode *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::BoxCoordinatesMode>
          (Arena *arena)

{
  BoxCoordinatesMode *this;
  
  if (arena == (Arena *)0x0) {
    this = (BoxCoordinatesMode *)operator_new(0x18);
    CoreML::Specification::BoxCoordinatesMode::BoxCoordinatesMode(this,(Arena *)0x0,false);
  }
  else {
    this = (BoxCoordinatesMode *)
           AllocateAlignedWithHook
                     (arena,0x18,(type_info *)&CoreML::Specification::BoxCoordinatesMode::typeinfo);
    CoreML::Specification::BoxCoordinatesMode::BoxCoordinatesMode(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }